

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * cargo_strndup(char *s,size_t n)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  sVar1 = strlen(s);
  if (sVar1 < n) {
    n = sVar1;
  }
  sVar1 = n + 1;
  if (sVar1 != 0) {
    if (replaced_cargo_malloc == (cargo_malloc_f)0x0) {
      __dest = malloc(sVar1);
    }
    else {
      __dest = (*replaced_cargo_malloc)(sVar1);
    }
    if (__dest != (void *)0x0) {
      *(undefined1 *)((long)__dest + n) = 0;
      pcVar2 = (char *)memcpy(__dest,s,n);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char *cargo_strndup(const char *s, size_t n)
{
    char *res;
    size_t len = strlen(s);

    if (n < len)
    {
        len = n;
    }

    if (!(res = (char *)_cargo_malloc(len + 1)))
    {
        return NULL;
    }

    res[len] = '\0';
    return (char *)memcpy(res, s, len);
}